

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

void av1_cnn_add_c(float **output,int channels,int width,int height,int stride,float **add)

{
  int iVar1;
  int j;
  int i;
  int c;
  float **add_local;
  int stride_local;
  int height_local;
  int width_local;
  int channels_local;
  float **output_local;
  
  for (c = 0; c < channels; c = c + 1) {
    for (i = 0; i < height; i = i + 1) {
      for (j = 0; j < width; j = j + 1) {
        iVar1 = i * stride + j;
        output[c][iVar1] = add[c][i * stride + j] + output[c][iVar1];
      }
    }
  }
  return;
}

Assistant:

void av1_cnn_add_c(float **output, int channels, int width, int height,
                   int stride, const float **add) {
  for (int c = 0; c < channels; ++c) {
    for (int i = 0; i < height; ++i)
      for (int j = 0; j < width; ++j)
        output[c][i * stride + j] += add[c][i * stride + j];
  }
}